

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_1.c
# Opt level: O1

void crypto_sign_ed25519_ref10_fe_1(int32_t *h)

{
  *h = 1;
  h[1] = 0;
  h[2] = 0;
  h[3] = 0;
  h[4] = 0;
  h[5] = 0;
  h[6] = 0;
  h[7] = 0;
  h[8] = 0;
  h[9] = 0;
  return;
}

Assistant:

void fe_1(fe h)
{
  h[0] = 1;
  h[1] = 0;
  h[2] = 0;
  h[3] = 0;
  h[4] = 0;
  h[5] = 0;
  h[6] = 0;
  h[7] = 0;
  h[8] = 0;
  h[9] = 0;
}